

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool flatbuffers::ReadEnvironmentVariable(char *var_name,string *_value)

{
  char *__s;
  allocator<char> local_39;
  string local_38 [32];
  
  __s = getenv(var_name);
  if (_value != (string *)0x0 && __s != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>(local_38,__s,&local_39);
    std::__cxx11::string::operator=((string *)_value,local_38);
    std::__cxx11::string::~string(local_38);
  }
  return __s != (char *)0x0;
}

Assistant:

bool ReadEnvironmentVariable(const char *var_name, std::string *_value) {
#ifdef _MSC_VER
  __pragma(warning(disable : 4996));  // _CRT_SECURE_NO_WARNINGS
#endif
  auto env_str = std::getenv(var_name);
  if (!env_str) return false;
  if (_value) *_value = std::string(env_str);
  return true;
}